

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O2

void remove_link_endpoint(LINK_ENDPOINT_HANDLE link_endpoint)

{
  SESSION_HANDLE pSVar1;
  uint uVar2;
  LINK_ENDPOINT_INSTANCE **ppLVar3;
  uint uVar4;
  ulong uVar5;
  
  pSVar1 = link_endpoint->session;
  uVar2 = pSVar1->link_endpoint_count;
  uVar5 = 0;
  while( true ) {
    if (uVar2 == uVar5) {
      return;
    }
    ppLVar3 = pSVar1->link_endpoints;
    if (ppLVar3[uVar5] == link_endpoint) break;
    uVar5 = uVar5 + 1;
  }
  uVar4 = (uint)uVar5;
  if (uVar4 < uVar2 - 1) {
    memmove(ppLVar3 + uVar5,ppLVar3 + (uVar4 + 1),(ulong)(~uVar4 + uVar2) << 3);
    uVar2 = pSVar1->link_endpoint_count;
  }
  uVar2 = uVar2 - 1;
  pSVar1->link_endpoint_count = uVar2;
  if (uVar2 == 0) {
    free(pSVar1->link_endpoints);
    ppLVar3 = (LINK_ENDPOINT_INSTANCE **)0x0;
  }
  else {
    ppLVar3 = (LINK_ENDPOINT_INSTANCE **)realloc(pSVar1->link_endpoints,(ulong)uVar2 << 3);
    if (ppLVar3 == (LINK_ENDPOINT_INSTANCE **)0x0) {
      return;
    }
  }
  pSVar1->link_endpoints = ppLVar3;
  return;
}

Assistant:

static void remove_link_endpoint(LINK_ENDPOINT_HANDLE link_endpoint)
{
    if (link_endpoint != NULL)
    {
        LINK_ENDPOINT_INSTANCE* endpoint_instance = (LINK_ENDPOINT_INSTANCE*)link_endpoint;
        SESSION_INSTANCE* session_instance = endpoint_instance->session;
        uint32_t i;

        for (i = 0; i < session_instance->link_endpoint_count; i++)
        {
            if (session_instance->link_endpoints[i] == link_endpoint)
            {
                break;
            }
        }

        if (i < session_instance->link_endpoint_count)
        {
            LINK_ENDPOINT_INSTANCE** new_endpoints;

            if (i < (session_instance->link_endpoint_count - 1))
            {
                (void)memmove(&session_instance->link_endpoints[i], &session_instance->link_endpoints[i + 1], (session_instance->link_endpoint_count - (uint32_t)i - 1) * sizeof(LINK_ENDPOINT_INSTANCE*));
            }

            session_instance->link_endpoint_count--;

            if (session_instance->link_endpoint_count == 0)
            {
                free(session_instance->link_endpoints);
                session_instance->link_endpoints = NULL;
            }
            else
            {
                size_t realloc_size = safe_multiply_size_t(sizeof(LINK_ENDPOINT_INSTANCE*), session_instance->link_endpoint_count);
                if (realloc_size != SIZE_MAX &&
                    (new_endpoints = (LINK_ENDPOINT_INSTANCE**)realloc(session_instance->link_endpoints, realloc_size)) != NULL)
                {
                    session_instance->link_endpoints = new_endpoints;
                }
            }
        }
    }
}